

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidget::setSelectedDate(QCalendarWidget *this,QDate date)

{
  undefined8 uVar1;
  QDate d_00;
  bool bVar2;
  int year;
  QCalendarWidgetPrivate *this_00;
  undefined8 in_RSI;
  QCalendarWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QCalendarWidgetPrivate *d;
  QCalendar cal;
  QDate newDate;
  QDate *in_stack_ffffffffffffff88;
  QCalendarModel *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  bool local_51;
  qint64 local_28;
  undefined8 local_20;
  qint64 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  this_00 = d_func((QCalendarWidget *)0x51f2ff);
  bVar2 = ::operator==((QDate *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_51 = false;
  if (bVar2) {
    local_18 = (qint64)QCalendarWidgetPrivate::getCurrentDate(this_00);
    local_51 = ::operator==((QDate *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  if ((local_51 == false) && (bVar2 = QDate::isValid((QDate *)in_RDI), bVar2)) {
    local_20 = local_10;
    d_00.jd._4_4_ = in_stack_ffffffffffffff9c;
    d_00.jd._0_4_ = in_stack_ffffffffffffff98;
    QtPrivate::QCalendarModel::setDate(in_stack_ffffffffffffff90,d_00);
    QCalendarWidgetPrivate::update(in_RDI);
    local_28 = (this_00->m_model->m_date).jd;
    uVar1 = *(undefined8 *)&this_00->m_model->m_calendar;
    year = QDate::year(&local_28,uVar1);
    QDate::month(&local_28,uVar1);
    QCalendarWidgetPrivate::showMonth(in_RDI,year,in_stack_ffffffffffffff98);
    selectionChanged((QCalendarWidget *)0x51f437);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarWidget::setSelectedDate(QDate date)
{
    Q_D(QCalendarWidget);
    if (d->m_model->m_date == date && date == d->getCurrentDate())
        return;

    if (!date.isValid())
        return;

    d->m_model->setDate(date);
    d->update();
    QDate newDate = d->m_model->m_date;
    QCalendar cal = d->m_model->m_calendar;
    d->showMonth(newDate.year(cal), newDate.month(cal));
    emit selectionChanged();
}